

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlUnlinkNode(xmlNodePtr cur)

{
  _xmlDoc *p_Var1;
  xmlDocPtr doc;
  xmlNodePtr cur_local;
  
  if ((cur != (xmlNodePtr)0x0) && (cur->type != XML_NAMESPACE_DECL)) {
    if ((cur->type == XML_DTD_NODE) && (p_Var1 = cur->doc, p_Var1 != (_xmlDoc *)0x0)) {
      if (p_Var1->intSubset == (_xmlDtd *)cur) {
        p_Var1->intSubset = (_xmlDtd *)0x0;
      }
      if (p_Var1->extSubset == (_xmlDtd *)cur) {
        p_Var1->extSubset = (_xmlDtd *)0x0;
      }
    }
    if (cur->type == XML_ENTITY_DECL) {
      xmlRemoveEntity((xmlEntityPtr)cur);
    }
    xmlUnlinkNodeInternal(cur);
  }
  return;
}

Assistant:

void
xmlUnlinkNode(xmlNodePtr cur) {
    if (cur == NULL)
	return;

    if (cur->type == XML_NAMESPACE_DECL)
        return;

    if (cur->type == XML_DTD_NODE) {
	xmlDocPtr doc = cur->doc;

	if (doc != NULL) {
	    if (doc->intSubset == (xmlDtdPtr) cur)
		doc->intSubset = NULL;
	    if (doc->extSubset == (xmlDtdPtr) cur)
		doc->extSubset = NULL;
	}
    }

    if (cur->type == XML_ENTITY_DECL)
        xmlRemoveEntity((xmlEntityPtr) cur);

    xmlUnlinkNodeInternal(cur);
}